

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void TryRunTics(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *listenactor;
  byte local_22;
  uint uStack_1c;
  bool doWait;
  int numplaying;
  int counts;
  int availabletics;
  int realtics;
  int lowtic;
  int i;
  
  if (pauseext) {
    r_NoInterpolate = true;
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&cl_capfps);
  local_22 = 1;
  if (!bVar1) {
    local_22 = r_NoInterpolate;
  }
  if ((local_22 & 1) == 0) {
    entertic = (*I_GetTime)(false);
  }
  else {
    entertic = (*I_WaitForTic)(oldentertics);
  }
  uVar2 = entertic - oldentertics;
  oldentertics = entertic;
  NetUpdate();
  if ((pauseext & 1U) == 0) {
    availabletics = 0x7fffffff;
    for (realtics = 0; realtics < doomcom.numnodes; realtics = realtics + 1) {
      if (((nodeingame[realtics] & 1U) != 0) && (nettics[realtics] < availabletics)) {
        availabletics = nettics[realtics];
      }
    }
    iVar3 = gametic;
    if (ticdup != 1) {
      iVar3 = gametic / ticdup;
    }
    numplaying = availabletics - iVar3;
    if ((int)uVar2 < numplaying + -1) {
      uStack_1c = uVar2 + 1;
    }
    else {
      uStack_1c = uVar2;
      if (numplaying <= (int)uVar2) {
        uStack_1c = numplaying;
      }
    }
    if ((uStack_1c == 0) && ((local_22 & 1) == 0)) {
      Net_CheckLastReceived(0);
      if (0 < (int)uVar2) {
        C_Ticker();
        M_Ticker();
        P_UnPredictPlayer();
        P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
      }
    }
    else {
      if ((int)uStack_1c < 1) {
        uStack_1c = 1;
      }
      if (debugfile != (FILE *)0x0) {
        fprintf((FILE *)debugfile,"=======real: %i  avail: %i  game: %i\n",(ulong)uVar2,
                (ulong)(uint)numplaying,(ulong)uStack_1c);
      }
      do {
        if ((int)(gametic + uStack_1c) <= availabletics) {
          hadlate = false;
          for (realtics = 0; realtics < 8; realtics = realtics + 1) {
            (&DAT_01ae71b4)[(long)realtics * 0x2a0] = 0;
          }
          lastglobalrecvtime = (*I_GetTime)(false);
          if ((int)uStack_1c < 1) {
            return;
          }
          P_UnPredictPlayer();
          while (uStack_1c != 0) {
            if (availabletics < gametic) {
              I_Error("gametic>lowtic");
            }
            if ((advancedemo & 1U) != 0) {
              D_DoAdvanceDemo();
            }
            if (debugfile != (FILE *)0x0) {
              fprintf((FILE *)debugfile,"run tic %d\n",(ulong)(uint)gametic);
            }
            C_Ticker();
            M_Ticker();
            (*I_GetTime)(true);
            G_Ticker();
            gametic = gametic + 1;
            NetUpdate();
            uStack_1c = uStack_1c - 1;
          }
          P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
          listenactor = TObjPtr::operator_cast_to_AActor_
                                  ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
          S_UpdateSounds(listenactor);
          return;
        }
        NetUpdate();
        availabletics = 0x7fffffff;
        for (realtics = 0; realtics < doomcom.numnodes; realtics = realtics + 1) {
          if (((nodeingame[realtics] & 1U) != 0) && (nettics[realtics] < availabletics)) {
            availabletics = nettics[realtics];
          }
        }
        availabletics = availabletics * ticdup;
        if (availabletics < gametic) {
          I_Error("TryRunTics: lowtic < gametic");
        }
        Net_CheckLastReceived(uStack_1c);
        iVar3 = (*I_GetTime)(false);
      } while (iVar3 - entertic < 1);
      C_Ticker();
      M_Ticker();
      P_UnPredictPlayer();
      P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
    }
  }
  return;
}

Assistant:

void TryRunTics (void)
{
	int 		i;
	int 		lowtic;
	int 		realtics;
	int 		availabletics;
	int 		counts;
	int 		numplaying;

	// If paused, do not eat more CPU time than we need, because it
	// will all be wasted anyway.
	if (pauseext) 
		r_NoInterpolate = true;
	bool doWait = cl_capfps || r_NoInterpolate /*|| netgame*/;

	// get real tics
	if (doWait)
	{
		entertic = I_WaitForTic (oldentertics);
	}
	else
	{
		entertic = I_GetTime (false);
	}
	realtics = entertic - oldentertics;
	oldentertics = entertic;

	// get available tics
	NetUpdate ();

	if (pauseext)
		return;

	lowtic = INT_MAX;
	numplaying = 0;
	for (i = 0; i < doomcom.numnodes; i++)
	{
		if (nodeingame[i])
		{
			numplaying++;
			if (nettics[i] < lowtic)
				lowtic = nettics[i];
		}
	}

	if (ticdup == 1)
	{
		availabletics = lowtic - gametic;
	}
	else
	{
		availabletics = lowtic - gametic / ticdup;
	}

	// decide how many tics to run
	if (realtics < availabletics-1)
		counts = realtics+1;
	else if (realtics < availabletics)
		counts = realtics;
	else
		counts = availabletics;
	
	// Uncapped framerate needs seprate checks
	if (counts == 0 && !doWait)
	{
		// Check possible stall conditions
		Net_CheckLastReceived(counts);
		if (realtics >= 1)
		{
			C_Ticker();
			M_Ticker();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
		}
		return;
	}

	if (counts < 1)
		counts = 1;

	if (debugfile)
		fprintf (debugfile,
				 "=======real: %i  avail: %i  game: %i\n",
				 realtics, availabletics, counts);

	// wait for new tics if needed
	while (lowtic < gametic + counts)
	{
		NetUpdate ();
		lowtic = INT_MAX;

		for (i = 0; i < doomcom.numnodes; i++)
			if (nodeingame[i] && nettics[i] < lowtic)
				lowtic = nettics[i];

		lowtic = lowtic * ticdup;

		if (lowtic < gametic)
			I_Error ("TryRunTics: lowtic < gametic");

		// Check possible stall conditions
		Net_CheckLastReceived (counts);

		// don't stay in here forever -- give the menu a chance to work
		if (I_GetTime (false) - entertic >= 1)
		{
			C_Ticker ();
			M_Ticker ();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
			return;
		}
	}

	//Tic lowtic is high enough to process this gametic. Clear all possible waiting info
	hadlate = false;
	for (i = 0; i < MAXPLAYERS; i++)
		players[i].waiting = false;
	lastglobalrecvtime = I_GetTime (false); //Update the last time the game tic'd over

	// run the count tics
	if (counts > 0)
	{
		P_UnPredictPlayer();
		while (counts--)
		{
			if (gametic > lowtic)
			{
				I_Error ("gametic>lowtic");
			}
			if (advancedemo)
			{
				D_DoAdvanceDemo ();
			}
			if (debugfile) fprintf (debugfile, "run tic %d\n", gametic);
			C_Ticker ();
			M_Ticker ();
			I_GetTime (true);
			G_Ticker();
			gametic++;

			NetUpdate ();	// check for new console commands
		}
		P_PredictPlayer(&players[consoleplayer]);
		S_UpdateSounds (players[consoleplayer].camera);	// move positional sounds
	}
}